

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall string_find_Test::TestBody(string_find_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  char *pcVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  char local_e0 [16];
  AssertionResult gtest_ar_34;
  char local_c0 [16];
  string haystack;
  undefined1 local_90 [24];
  char acStack_78 [8];
  buffer<char> local_70;
  buffer<char> local_50;
  
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  pcVar3 = haystack.m_buffer.m_data;
  haystack.m_buffer.m_size = 8;
  builtin_strncpy(haystack.m_buffer.m_data,"ABCDabcd",9);
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"0",
             "ST::string::from_validated(\"\" \"ABCDabcd\" \"\", sizeof(\"ABCDabcd\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x673,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  ST::buffer<char>::buffer(&haystack.m_buffer,"abcdABCDABCDabcd",0x10);
  gtest_ar_34._0_8_ = ST::string::find((string *)&haystack.m_buffer,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x674,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  haystack.m_buffer.m_size = 0xc;
  builtin_strncpy(haystack.m_buffer.m_data,"abcdABCDabcd",0xd);
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"abcdABCDabcd\" \"\", sizeof(\"abcdABCDabcd\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x675,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  haystack.m_buffer.m_size = 8;
  builtin_strncpy(haystack.m_buffer.m_data,"abcdABCD",9);
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  local_90._0_4_ = 4;
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"abcdABCD\" \"\", sizeof(\"abcdABCD\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x676,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  haystack.m_buffer.m_size = 8;
  builtin_strncpy(haystack.m_buffer.m_data,"ABCDxxxx",9);
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"0",
             "ST::string::from_validated(\"\" \"ABCDxxxx\" \"\", sizeof(\"ABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x679,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  ST::buffer<char>::buffer(&haystack.m_buffer,"xxxxABCDABCDxxxx",0x10);
  gtest_ar_34._0_8_ = ST::string::find((string *)&haystack.m_buffer,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDABCDxxxx\" \"\", sizeof(\"xxxxABCDABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  haystack.m_buffer.m_size = 0xc;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxABCDxxxx",0xd);
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDxxxx\" \"\", sizeof(\"xxxxABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  haystack.m_buffer.m_size = 8;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxABCD",9);
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  local_90._0_4_ = 4;
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"xxxxABCD\" \"\", sizeof(\"xxxxABCD\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  haystack.m_buffer.m_size = 8;
  builtin_strncpy(haystack.m_buffer.m_data,"abcdxxxx",9);
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"0",
             "ST::string::from_validated(\"\" \"abcdxxxx\" \"\", sizeof(\"abcdxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  ST::buffer<char>::buffer(&haystack.m_buffer,"xxxxabcdABCDxxxx",0x10);
  gtest_ar_34._0_8_ = ST::string::find((string *)&haystack.m_buffer,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdABCDxxxx\" \"\", sizeof(\"xxxxabcdABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  haystack.m_buffer.m_size = 0xc;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxabcdxxxx",0xd);
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdxxxx\" \"\", sizeof(\"xxxxabcdxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  haystack.m_buffer.m_size = 8;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxabcd",9);
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  local_90._0_4_ = 4;
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"xxxxabcd\" \"\", sizeof(\"xxxxabcd\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x680,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  haystack.m_buffer.m_size = 8;
  builtin_strncpy(haystack.m_buffer.m_data,"ABCDxxxx",9);
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"abcd",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"0",
             "ST::string::from_validated(\"\" \"ABCDxxxx\" \"\", sizeof(\"ABCDxxxx\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x681,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  ST::buffer<char>::buffer(&haystack.m_buffer,"xxxxABCDabcdxxxx",0x10);
  gtest_ar_34._0_8_ = ST::string::find((string *)&haystack.m_buffer,"abcd",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDabcdxxxx\" \"\", sizeof(\"xxxxABCDabcdxxxx\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x682,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  haystack.m_buffer.m_size = 0xc;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxABCDxxxx",0xd);
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"abcd",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDxxxx\" \"\", sizeof(\"xxxxABCDxxxx\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x683,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  haystack.m_buffer.m_size = 8;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxABCD",9);
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  local_90._0_4_ = 4;
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"abcd",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4",
             "ST::string::from_validated(\"\" \"xxxxABCD\" \"\", sizeof(\"xxxxABCD\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x684,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 4;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxx",5);
  haystack.m_buffer.m_data[5] = '\0';
  haystack.m_buffer.m_data[6] = '\0';
  haystack.m_buffer.m_data[7] = '\0';
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x687,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 4;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxx",5);
  haystack.m_buffer.m_data[5] = '\0';
  haystack.m_buffer.m_data[6] = '\0';
  haystack.m_buffer.m_data[7] = '\0';
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x688,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 7;
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxABC",8);
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1",
             "ST::string::from_validated(\"\" \"xxxxABC\" \"\", sizeof(\"xxxxABC\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x689,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 7;
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxABC",8);
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1",
             "ST::string::from_validated(\"\" \"xxxxABC\" \"\", sizeof(\"xxxxABC\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 0xb;
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxABCxxxx",0xc);
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1",
             "ST::string::from_validated(\"\" \"xxxxABCxxxx\" \"\", sizeof(\"xxxxABCxxxx\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 0xb;
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(haystack.m_buffer.m_data,"xxxxABCxxxx",0xc);
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1",
             "ST::string::from_validated(\"\" \"xxxxABCxxxx\" \"\", sizeof(\"xxxxABCxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 0;
  haystack.m_buffer.m_data[0] = '\0';
  haystack.m_buffer.m_data[1] = '\0';
  haystack.m_buffer.m_data[2] = '\0';
  haystack.m_buffer.m_data[3] = '\0';
  haystack.m_buffer.m_data[4] = '\0';
  haystack.m_buffer.m_data[5] = '\0';
  haystack.m_buffer.m_data[6] = '\0';
  haystack.m_buffer.m_data[7] = '\0';
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"AAAA",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1","ST::string().find(\"AAAA\", ST::case_sensitive)",
             (int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 0;
  haystack.m_buffer.m_data[0] = '\0';
  haystack.m_buffer.m_data[1] = '\0';
  haystack.m_buffer.m_data[2] = '\0';
  haystack.m_buffer.m_data[3] = '\0';
  haystack.m_buffer.m_data[4] = '\0';
  haystack.m_buffer.m_data[5] = '\0';
  haystack.m_buffer.m_data[6] = '\0';
  haystack.m_buffer.m_data[7] = '\0';
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"AAAA",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1","ST::string().find(\"AAAA\", ST::case_insensitive)",
             (int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x690,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 4;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxx",5);
  haystack.m_buffer.m_data[5] = '\0';
  haystack.m_buffer.m_data[6] = '\0';
  haystack.m_buffer.m_data[7] = '\0';
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  pcVar2 = "";
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"\", ST::case_sensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x691,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 4;
  builtin_strncpy(haystack.m_buffer.m_data,"xxxx",5);
  haystack.m_buffer.m_data[5] = '\0';
  haystack.m_buffer.m_data[6] = '\0';
  haystack.m_buffer.m_data[7] = '\0';
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,(char *)0x0,case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find((const char *)nullptr, ST::case_sensitive)"
             ,(int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x692,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 0;
  haystack.m_buffer.m_data[0] = '\0';
  haystack.m_buffer.m_data[1] = '\0';
  haystack.m_buffer.m_data[2] = '\0';
  haystack.m_buffer.m_data[3] = '\0';
  haystack.m_buffer.m_data[4] = '\0';
  haystack.m_buffer.m_data[5] = '\0';
  haystack.m_buffer.m_data[6] = '\0';
  haystack.m_buffer.m_data[7] = '\0';
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  pcVar2 = "";
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,"",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1","ST::string().find(\"\", ST::case_sensitive)",
             (int *)local_90,(long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x693,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 0xffffffff;
  haystack.m_buffer.m_size = 0;
  haystack.m_buffer.m_data[0] = '\0';
  haystack.m_buffer.m_data[1] = '\0';
  haystack.m_buffer.m_data[2] = '\0';
  haystack.m_buffer.m_data[3] = '\0';
  haystack.m_buffer.m_data[4] = '\0';
  haystack.m_buffer.m_data[5] = '\0';
  haystack.m_buffer.m_data[6] = '\0';
  haystack.m_buffer.m_data[7] = '\0';
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,(char *)0x0,case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-1",
             "ST::string().find((const char *)nullptr, ST::case_sensitive)",(int *)local_90,
             (long *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&haystack);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x694,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34,(Message *)&haystack);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34);
    if (haystack.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)haystack.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  haystack.m_buffer.m_size = 0;
  haystack.m_buffer.m_data[0] = '\0';
  haystack.m_buffer.m_data[1] = '\0';
  haystack.m_buffer.m_data[2] = '\0';
  haystack.m_buffer.m_data[3] = '\0';
  haystack.m_buffer.m_data[4] = '\0';
  haystack.m_buffer.m_data[5] = '\0';
  haystack.m_buffer.m_data[6] = '\0';
  haystack.m_buffer.m_data[7] = '\0';
  haystack.m_buffer.m_data[8] = '\0';
  haystack.m_buffer.m_data[9] = '\0';
  haystack.m_buffer.m_data[10] = '\0';
  haystack.m_buffer.m_data[0xb] = '\0';
  haystack.m_buffer.m_data[0xc] = '\0';
  haystack.m_buffer.m_data[0xd] = '\0';
  haystack.m_buffer.m_data[0xe] = '\0';
  haystack.m_buffer.m_data[0xf] = '\0';
  gtest_ar_34._0_8_ = local_c0;
  gtest_ar_34.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4;
  local_c0[8] = '\0';
  local_c0[9] = '\0';
  local_c0[10] = '\0';
  local_c0[0xb] = '\0';
  local_c0[0xc] = '\0';
  local_c0[0xd] = '\0';
  local_c0[0xe] = '\0';
  local_c0[0xf] = '\0';
  builtin_strncpy(local_c0,"xxxx",5);
  local_c0[5] = '\0';
  local_c0[6] = '\0';
  local_c0[7] = '\0';
  haystack.m_buffer.m_chars = pcVar3;
  ST::string::from_utf32
            ((string *)local_90,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff
             ,check_validity);
  ST::operator+((string *)&gtest_ar,(string *)&gtest_ar_34,(string *)local_90);
  pcVar2 = haystack.m_buffer.m_chars;
  uVar1 = gtest_ar.message_;
  haystack.m_buffer.m_chars = (char *)gtest_ar._0_8_;
  gtest_ar._0_8_ = pcVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )haystack.m_buffer.m_size;
  haystack.m_buffer.m_size =
       (size_t)uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  haystack.m_buffer.m_data._0_4_ = SUB84(local_e0._0_8_,0);
  haystack.m_buffer.m_data._4_4_ = SUB84(local_e0._0_8_,4);
  haystack.m_buffer.m_data._8_4_ = SUB84(local_e0._8_8_,0);
  haystack.m_buffer.m_data._12_4_ = SUB84(local_e0._8_8_,4);
  if ((ulong)uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl < 0x10) {
    haystack.m_buffer.m_chars = pcVar3;
  }
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  ST::buffer<char>::~buffer((buffer<char> *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar_34);
  local_90._0_4_ = 4;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,utf8_test_data,case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4","haystack.find(utf8_test_data, ST::case_sensitive)",
             (int *)local_90,(long *)&gtest_ar_34);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_34);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x699,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar_34);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar_34._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_34._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,utf8_test_data,case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4","haystack.find(utf8_test_data, ST::case_insensitive)",
             (int *)local_90,(long *)&gtest_ar_34);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_34);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x69a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar_34);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar_34._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_34._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ST::string::from_utf32
            ((string *)&gtest_ar_34,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",
             0xffffffffffffffff,check_validity);
  local_90._8_8_ = 4;
  acStack_78[0] = '\0';
  acStack_78[1] = '\0';
  acStack_78[2] = '\0';
  acStack_78[3] = '\0';
  acStack_78[4] = '\0';
  acStack_78[5] = '\0';
  acStack_78[6] = '\0';
  acStack_78[7] = '\0';
  local_90[0x10] = 'x';
  local_90[0x11] = 'x';
  local_90[0x12] = 'x';
  local_90[0x13] = 'x';
  local_90[0x14] = '\0';
  local_90[0x15] = '\0';
  local_90[0x16] = '\0';
  local_90[0x17] = '\0';
  local_90._0_8_ = (AssertHelperData *)(local_90 + 0x10);
  ST::operator+((string *)&gtest_ar,(string *)&gtest_ar_34,(string *)local_90);
  pcVar2 = haystack.m_buffer.m_chars;
  uVar1 = gtest_ar.message_;
  haystack.m_buffer.m_chars = (char *)gtest_ar._0_8_;
  gtest_ar._0_8_ = pcVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )haystack.m_buffer.m_size;
  haystack.m_buffer.m_size =
       (size_t)uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  haystack.m_buffer.m_data._0_4_ = SUB84(local_e0._0_8_,0);
  haystack.m_buffer.m_data._4_4_ = SUB84(local_e0._0_8_,4);
  haystack.m_buffer.m_data._8_4_ = SUB84(local_e0._8_8_,0);
  haystack.m_buffer.m_data._12_4_ = SUB84(local_e0._8_8_,4);
  if ((ulong)uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl < 0x10) {
    haystack.m_buffer.m_chars = pcVar3;
  }
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  ST::buffer<char>::~buffer((buffer<char> *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar_34);
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,utf8_test_data,case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"0","haystack.find(utf8_test_data, ST::case_sensitive)",
             (int *)local_90,(long *)&gtest_ar_34);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_34);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x69d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar_34);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar_34._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_34._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,utf8_test_data,case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"0","haystack.find(utf8_test_data, ST::case_insensitive)",
             (int *)local_90,(long *)&gtest_ar_34);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_34);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x69e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar_34);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar_34._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_34._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._8_8_ = 4;
  acStack_78[0] = '\0';
  acStack_78[1] = '\0';
  acStack_78[2] = '\0';
  acStack_78[3] = '\0';
  acStack_78[4] = '\0';
  acStack_78[5] = '\0';
  acStack_78[6] = '\0';
  acStack_78[7] = '\0';
  local_90[0x10] = 'x';
  local_90[0x11] = 'x';
  local_90[0x12] = 'x';
  local_90[0x13] = 'x';
  local_90[0x14] = '\0';
  local_90[0x15] = '\0';
  local_90[0x16] = '\0';
  local_90[0x17] = '\0';
  local_90._0_8_ = (AssertHelperData *)(local_90 + 0x10);
  ST::string::from_utf32
            ((string *)&local_70,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",
             0xffffffffffffffff,check_validity);
  ST::operator+((string *)&gtest_ar_34,(string *)local_90,(string *)&local_70);
  local_50.m_chars = local_50.m_data;
  local_50.m_size = 4;
  local_50.m_data[8] = '\0';
  local_50.m_data[9] = '\0';
  local_50.m_data[10] = '\0';
  local_50.m_data[0xb] = '\0';
  local_50.m_data[0xc] = '\0';
  local_50.m_data[0xd] = '\0';
  local_50.m_data[0xe] = '\0';
  local_50.m_data[0xf] = '\0';
  builtin_strncpy(local_50.m_data,"xxxx",5);
  local_50.m_data[5] = '\0';
  local_50.m_data[6] = '\0';
  local_50.m_data[7] = '\0';
  ST::operator+((string *)&gtest_ar,(string *)&gtest_ar_34,(string *)&local_50);
  pcVar2 = haystack.m_buffer.m_chars;
  uVar1 = gtest_ar.message_;
  haystack.m_buffer.m_chars = (char *)gtest_ar._0_8_;
  gtest_ar._0_8_ = pcVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )haystack.m_buffer.m_size;
  haystack.m_buffer.m_size =
       (size_t)uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  haystack.m_buffer.m_data._0_4_ = SUB84(local_e0._0_8_,0);
  haystack.m_buffer.m_data._4_4_ = SUB84(local_e0._0_8_,4);
  haystack.m_buffer.m_data._8_4_ = SUB84(local_e0._8_8_,0);
  haystack.m_buffer.m_data._12_4_ = SUB84(local_e0._8_8_,4);
  if ((ulong)uVar1._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl < 0x10) {
    haystack.m_buffer.m_chars = pcVar3;
  }
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  ST::buffer<char>::~buffer(&local_50);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar_34);
  ST::buffer<char>::~buffer(&local_70);
  ST::buffer<char>::~buffer((buffer<char> *)local_90);
  local_90._0_4_ = 4;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,utf8_test_data,case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4","haystack.find(utf8_test_data, ST::case_sensitive)",
             (int *)local_90,(long *)&gtest_ar_34);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_34);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar_34);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar_34._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_34._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_90._0_4_ = 4;
  gtest_ar_34._0_8_ = ST::string::find(&haystack,utf8_test_data,case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"4","haystack.find(utf8_test_data, ST::case_insensitive)",
             (int *)local_90,(long *)&gtest_ar_34);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_34);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar_34);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar_34._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_34._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x8;
  builtin_strncpy(local_e0,"ABCDabcd",9);
  local_e0[9] = '\0';
  local_e0[10] = '\0';
  local_e0[0xb] = '\0';
  local_e0[0xc] = '\0';
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,1,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"ABCDabcd\" \"\", sizeof(\"ABCDabcd\") - 1).find(1, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 4;
  ST::buffer<char>::buffer((buffer<char> *)&gtest_ar,"abcdABCDABCDabcd",0x10);
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,1,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"4",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(1, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 4;
  ST::buffer<char>::buffer((buffer<char> *)&gtest_ar,"abcdABCDABCDabcd",0x10);
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,4,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"4",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(4, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 8;
  ST::buffer<char>::buffer((buffer<char> *)&gtest_ar,"abcdABCDABCDabcd",0x10);
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,5,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"8",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(5, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc;
  builtin_strncpy(local_e0,"abcdABCDabcd",0xd);
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,5,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"abcdABCDabcd\" \"\", sizeof(\"abcdABCDabcd\") - 1).find(5, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc;
  builtin_strncpy(local_e0,"abcdABCDabcd",0xd);
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,100,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"abcdABCDabcd\" \"\", sizeof(\"abcdABCDabcd\") - 1).find(100, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6aa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x8;
  builtin_strncpy(local_e0,"abcdxxxx",9);
  local_e0[9] = '\0';
  local_e0[10] = '\0';
  local_e0[0xb] = '\0';
  local_e0[0xc] = '\0';
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,1,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"abcdxxxx\" \"\", sizeof(\"abcdxxxx\") - 1).find(1, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6ad,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 4;
  ST::buffer<char>::buffer((buffer<char> *)&gtest_ar,"xxxxabcdabcdxxxx",0x10);
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,1,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdabcdxxxx\" \"\", sizeof(\"xxxxabcdabcdxxxx\") - 1).find(1, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6ae,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 4;
  ST::buffer<char>::buffer((buffer<char> *)&gtest_ar,"xxxxabcdabcdxxxx",0x10);
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,4,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdabcdxxxx\" \"\", sizeof(\"xxxxabcdabcdxxxx\") - 1).find(4, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6af,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 8;
  ST::buffer<char>::buffer((buffer<char> *)&gtest_ar,"xxxxabcdabcdxxxx",0x10);
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,5,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"8",
             "ST::string::from_validated(\"\" \"xxxxabcdabcdxxxx\" \"\", sizeof(\"xxxxabcdabcdxxxx\") - 1).find(5, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc;
  builtin_strncpy(local_e0,"xxxxabcdxxxx",0xd);
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,5,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"xxxxabcdxxxx\" \"\", sizeof(\"xxxxabcdxxxx\") - 1).find(5, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc;
  builtin_strncpy(local_e0,"xxxxabcdxxxx",0xd);
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,100,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"xxxxabcdxxxx\" \"\", sizeof(\"xxxxabcdxxxx\") - 1).find(100, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4;
  local_e0[8] = '\0';
  local_e0[9] = '\0';
  local_e0[10] = '\0';
  local_e0[0xb] = '\0';
  local_e0[0xc] = '\0';
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  builtin_strncpy(local_e0,"xxxx",5);
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  pcVar3 = "";
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,"",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"\", ST::case_sensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4;
  local_e0[8] = '\0';
  local_e0[9] = '\0';
  local_e0[10] = '\0';
  local_e0[0xb] = '\0';
  local_e0[0xc] = '\0';
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  builtin_strncpy(local_e0,"xxxx",5);
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  pcVar3 = "";
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,"",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"\", ST::case_insensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4;
  local_e0[8] = '\0';
  local_e0[9] = '\0';
  local_e0[10] = '\0';
  local_e0[0xb] = '\0';
  local_e0[0xc] = '\0';
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  builtin_strncpy(local_e0,"xxxx",5);
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  pcVar3 = "";
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,4,"",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(4, \"\", ST::case_sensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  local_70.m_chars._0_4_ = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4;
  local_e0[8] = '\0';
  local_e0[9] = '\0';
  local_e0[10] = '\0';
  local_e0[0xb] = '\0';
  local_e0[0xc] = '\0';
  local_e0[0xd] = '\0';
  local_e0[0xe] = '\0';
  local_e0[0xf] = '\0';
  builtin_strncpy(local_e0,"xxxx",5);
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  pcVar3 = "";
  gtest_ar._0_8_ = local_e0;
  local_90._0_8_ = ST::string::find((string *)&gtest_ar,4,"",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_34,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(4, \"\", ST::case_insensitive)"
             ,(int *)&local_70,(long *)local_90);
  ST::buffer<char>::~buffer((buffer<char> *)&gtest_ar);
  if (gtest_ar_34.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_34.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = *(char **)gtest_ar_34.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_34.message_);
  ST::buffer<char>::~buffer(&haystack.m_buffer);
  return;
}

Assistant:

TEST(string, find)
{
    // Available string, case sensitive
    EXPECT_EQ(0, ST_LITERAL("ABCDabcd").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(4, ST_LITERAL("abcdABCDABCDabcd").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(4, ST_LITERAL("abcdABCDabcd").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(4, ST_LITERAL("abcdABCD").find("ABCD", ST::case_sensitive));

    // Available string, case insensitive
    EXPECT_EQ(0, ST_LITERAL("ABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCD").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(0, ST_LITERAL("abcdxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxabcdABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxabcdxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxabcd").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(0, ST_LITERAL("ABCDxxxx").find("abcd", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDabcdxxxx").find("abcd", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDxxxx").find("abcd", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCD").find("abcd", ST::case_insensitive));

    // Unavailable string
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABC").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABC").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABCxxxx").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABCxxxx").find("ABCD", ST::case_insensitive));

    // Empty string
    EXPECT_EQ(-1, ST::string().find("AAAA", ST::case_sensitive));
    EXPECT_EQ(-1, ST::string().find("AAAA", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find((const char *)nullptr, ST::case_sensitive));
    EXPECT_EQ(-1, ST::string().find("", ST::case_sensitive));
    EXPECT_EQ(-1, ST::string().find((const char *)nullptr, ST::case_sensitive));

    // Unicode substring
    ST::string haystack;
    haystack = ST_LITERAL("xxxx") + ST::string::from_utf32(test_data);
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_sensitive));
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_insensitive));

    haystack = ST::string::from_utf32(test_data) + ST_LITERAL("xxxx");
    EXPECT_EQ(0, haystack.find(utf8_test_data, ST::case_sensitive));
    EXPECT_EQ(0, haystack.find(utf8_test_data, ST::case_insensitive));

    haystack = ST_LITERAL("xxxx") + ST::string::from_utf32(test_data) + ST_LITERAL("xxxx");
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_sensitive));
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_insensitive));

    // Starting position, case senstive
    EXPECT_EQ(-1, ST_LITERAL("ABCDabcd").find(1, "ABCD", ST::case_sensitive));
    EXPECT_EQ( 4, ST_LITERAL("abcdABCDABCDabcd").find(1, "ABCD", ST::case_sensitive));
    EXPECT_EQ( 4, ST_LITERAL("abcdABCDABCDabcd").find(4, "ABCD", ST::case_sensitive));
    EXPECT_EQ( 8, ST_LITERAL("abcdABCDABCDabcd").find(5, "ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("abcdABCDabcd").find(5, "ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("abcdABCDabcd").find(100, "ABCD", ST::case_sensitive));

    // Starting position, case insenstive
    EXPECT_EQ(-1, ST_LITERAL("abcdxxxx").find(1, "ABCD", ST::case_insensitive));
    EXPECT_EQ( 4, ST_LITERAL("xxxxabcdabcdxxxx").find(1, "ABCD", ST::case_insensitive));
    EXPECT_EQ( 4, ST_LITERAL("xxxxabcdabcdxxxx").find(4, "ABCD", ST::case_insensitive));
    EXPECT_EQ( 8, ST_LITERAL("xxxxabcdabcdxxxx").find(5, "ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxabcdxxxx").find(5, "ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxabcdxxxx").find(100, "ABCD", ST::case_insensitive));

    // Empty search string
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find(4, "", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find(4, "", ST::case_insensitive));
}